

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

longdouble * cast_string_to_number(longdouble *__return_storage_ptr__,char *str)

{
  int *piVar1;
  longdouble *plVar2;
  char *local_30;
  char *ptr;
  longdouble num;
  longdouble *local_10;
  char *str_local;
  
  local_10 = __return_storage_ptr__;
  piVar1 = __errno_location();
  *piVar1 = 0;
  strtold((char *)local_10,&local_30);
  plVar2 = (longdouble *)__errno_location();
  if (*(int *)plVar2 == 0) {
    plVar2 = (longdouble *)(ulong)(uint)(int)*local_30;
  }
  return plVar2;
}

Assistant:

static long double
cast_string_to_number(const char *str)
{
    long double num;
    char *ptr;

    errno = 0;
    num = strtold(str, &ptr);
    if (errno || *ptr) {
        num = NAN;
    }
    return num;
}